

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O0

void __thiscall icu_63::SkippedState::setFirstSkipped(SkippedState *this,UChar32 c)

{
  UChar32 c_local;
  SkippedState *this_local;
  
  this->skipLengthAtMatch = 0;
  UnicodeString::setTo(&this->newBuffer,c);
  return;
}

Assistant:

void setFirstSkipped(UChar32 c) {
        skipLengthAtMatch = 0;
        newBuffer.setTo(c);
    }